

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O2

void * coll_tmap_insert(coll_tmap_t *map,void *key,void *value)

{
  coll_tmap_entry_t *pcVar1;
  void *pvVar2;
  uint uVar3;
  long lVar4;
  entry_t_conflict *peVar5;
  entry_t_conflict *peVar6;
  coll_tmap_entry_t *pcVar7;
  entry_t_conflict *peVar8;
  coll_tmap_entry_t *parent;
  entry_t_conflict *entry;
  
  if (map->root == (coll_tmap_entry_t *)0x0) {
    peVar5 = entry_new(key,value,(void *)0x0);
    map->root = peVar5;
    map->size = map->size + 1;
  }
  else {
    uVar3 = 0;
    pcVar1 = map->root;
    parent = (coll_tmap_entry_t *)0x0;
    while (pcVar7 = pcVar1, pcVar7 != (coll_tmap_entry_t *)0x0) {
      uVar3 = (*map->cmp)(key,pcVar7->key);
      lVar4 = 0x10;
      if ((-1 < (int)uVar3) && (lVar4 = 0x18, uVar3 == 0)) {
        pvVar2 = pcVar7->val;
        pcVar7->val = value;
        return pvVar2;
      }
      parent = pcVar7;
      pcVar1 = *(coll_tmap_entry_t **)((long)&pcVar7->key + lVar4);
    }
    peVar5 = entry_new(key,value,parent);
    (&parent->left)[~uVar3 >> 0x1f] = peVar5;
    if (peVar5 != (entry_t_conflict *)0x0) {
      peVar5->color = '\x01';
    }
    while (((peVar8 = map->root, peVar5 != (entry_t_conflict *)0x0 && (peVar5 != peVar8)) &&
           (entry = peVar5->parent, entry->color == '\x01'))) {
      peVar8 = entry->parent;
      if (peVar8 == (entry_t_conflict *)0x0) {
LAB_00105600:
        peVar6 = entry;
        if (peVar5 == entry->left) {
          entry_rotate_right(map,entry);
          peVar6 = entry->parent;
          if (peVar6 != (entry_t_conflict *)0x0) {
            peVar8 = peVar6->parent;
            peVar5 = entry;
            goto LAB_00105626;
          }
LAB_00105635:
          peVar8 = (entry_t_conflict *)0x0;
        }
        else {
LAB_00105626:
          peVar6->color = '\0';
          entry = peVar5;
          if (peVar8 == (entry_t_conflict *)0x0) goto LAB_00105635;
          peVar8->color = '\x01';
        }
        entry_rotate_left(map,peVar8);
        peVar5 = entry;
      }
      else {
        peVar6 = peVar8->left;
        if (entry == peVar6) {
          peVar6 = peVar8->right;
          if ((peVar6 != (entry_t_conflict *)0x0) && (peVar6->color == '\x01')) goto LAB_00105656;
          if (peVar5 == entry->right) {
            entry_rotate_left(map,entry);
            pcVar1 = entry->parent;
            if (pcVar1 != (coll_tmap_entry_t *)0x0) {
              peVar8 = pcVar1->parent;
              pcVar1->color = '\0';
              if (peVar8 != (entry_t_conflict *)0x0) goto LAB_00105678;
            }
            peVar8 = (entry_t_conflict *)0x0;
            peVar5 = entry;
          }
          else {
            entry->color = '\0';
            entry = peVar5;
LAB_00105678:
            peVar8->color = '\x01';
            peVar5 = entry;
          }
          entry_rotate_right(map,peVar8);
        }
        else {
          if ((peVar6 == (entry_t_conflict *)0x0) || (peVar6->color != '\x01')) goto LAB_00105600;
LAB_00105656:
          entry->color = '\0';
          peVar6->color = '\0';
          peVar8->color = '\x01';
          peVar5 = peVar8;
        }
      }
    }
    if (peVar8 != (entry_t_conflict *)0x0) {
      peVar8->color = '\0';
    }
    map->size = map->size + 1;
  }
  return (void *)0x0;
}

Assistant:

void *coll_tmap_insert(coll_tmap_t *map, void *key, void *value) {
    entry_t *cur = map->root;
    if (!cur) {
        map->root = entry_new(key, value, NULL);
        ++(map->size);
        return NULL;
    }
    entry_t *parent = NULL;
    int result = 0;
    while (cur) {
        parent = cur;
        result = map->cmp(key, cur->key);
        if (result < 0) {
            cur = cur->left;
        } else if (result > 0) {
            cur = cur->right;
        } else {
            void *old = cur->val;
            cur->val = value;
            return old;
        }
    }
    entry_t *entry = entry_new(key, value, parent);
    if (result < 0) {
        parent->left = entry;
    } else {
        parent->right = entry;
    }
    coll_tmap_balance_insert(map, entry);
    ++(map->size);
    return NULL;
}